

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_generator.cpp
# Opt level: O1

uint32_t __thiscall defyx::Blake2Generator::getUInt32(Blake2Generator *this)

{
  uint32_t uVar1;
  
  if (this->dataIndex - 0x3d < 0xffffffffffffffbf) {
    blake2b(this,0x40,this,0x40,(void *)0x0,0);
    this->dataIndex = 0;
  }
  uVar1 = *(uint32_t *)(this->data + this->dataIndex);
  this->dataIndex = this->dataIndex + 4;
  return uVar1;
}

Assistant:

uint32_t Blake2Generator::getUInt32() {
		checkData(4);
		auto ret = load32(&data[dataIndex]);
		dataIndex += 4;
		return ret;
	}